

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::computeMinMaxValues
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,double side,double val,double minRes,
          double maxRes,double *minVal,double *maxVal)

{
  bool bVar1;
  element_type *peVar2;
  double *pdVar3;
  double *in_RCX;
  double *in_RDX;
  double in_XMM0_Qa;
  Real RVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  SPxSimplifier<double> *in_stack_ffffffffffffff28;
  double dVar5;
  
  *in_RDX = 0.0;
  *in_RCX = 0.0;
  SPxSimplifier<double>::tolerances(in_stack_ffffffffffffff28);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2cf691);
  RVar4 = Tolerances::epsilon(peVar2);
  bVar1 = LT<double,double,double>(in_XMM1_Qa,0.0,RVar4);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2cf6c6);
  if (bVar1) {
    pdVar3 = (double *)infinity();
    if (-*pdVar3 < in_XMM2_Qa) {
      *in_RDX = (in_XMM0_Qa - in_XMM2_Qa) / in_XMM1_Qa;
    }
    else {
      pdVar3 = (double *)infinity();
      *in_RDX = -*pdVar3;
    }
    pdVar3 = (double *)infinity();
    if (in_XMM3_Qa < *pdVar3) {
      *in_RCX = (in_XMM0_Qa - in_XMM3_Qa) / in_XMM1_Qa;
    }
    else {
      pdVar3 = (double *)infinity();
      *in_RCX = *pdVar3;
    }
  }
  else {
    SPxSimplifier<double>::tolerances(in_stack_ffffffffffffff28);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2cf816);
    RVar4 = Tolerances::epsilon(peVar2);
    bVar1 = GT<double,double,double>(in_XMM1_Qa,0.0,RVar4);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2cf848);
    if (bVar1) {
      pdVar3 = (double *)infinity();
      if (in_XMM3_Qa < *pdVar3) {
        *in_RDX = (in_XMM0_Qa - in_XMM3_Qa) / in_XMM1_Qa;
      }
      else {
        pdVar3 = (double *)infinity();
        *in_RDX = -*pdVar3;
      }
      dVar5 = in_XMM2_Qa;
      pdVar3 = (double *)infinity();
      if (-*pdVar3 < dVar5) {
        *in_RCX = (in_XMM0_Qa - in_XMM2_Qa) / in_XMM1_Qa;
      }
      else {
        pdVar3 = (double *)infinity();
        *in_RCX = *pdVar3;
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}